

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts_test.c
# Opt level: O1

void basic_opts_tests(zt_unit_test *test,void *data)

{
  int iVar1;
  char *pcVar2;
  undefined8 uVar3;
  int nargc;
  zt_opt_def options [9];
  int local_1ec;
  zt_opt_def_t local_1e8 [9];
  
  local_1ec = 0xd;
  memcpy(local_1e8,&DAT_0013cef0,0x1b0);
  pcVar2 = zt_opt_error_str(0x16,"test");
  iVar1 = strcmp("error: { code: 22, string: \"Invalid argument: test\" }",pcVar2);
  if (iVar1 == 0) {
    zt_unit_test_add_assertion(test);
    iVar1 = zt_opt_process_args(&local_1ec,s_argv,local_1e8,(zt_opt_validate)0x0,local_error);
    if (iVar1 == 0) {
      zt_unit_test_add_assertion(test);
      if (local_1ec < 0xd) {
        zt_unit_test_add_assertion(test);
        if (local_1ec == 8) {
          zt_unit_test_add_assertion(test);
          if (s_argv[local_1ec] == (char *)0x0) {
            pcVar2 = "pargv[nargc] != NULL";
            uVar3 = 0x6a;
          }
          else {
            zt_unit_test_add_assertion(test);
            iVar1 = strcmp(s_argv[local_1ec],"test_command");
            if (iVar1 == 0) {
              zt_unit_test_add_assertion(test);
              if (long_integer == 1) {
                zt_unit_test_add_assertion(test);
                if (bool_type == 1) {
                  zt_unit_test_add_assertion(test);
                  if (str != (char *)0x0) {
                    iVar1 = strcmp(str,"hello");
                    if (iVar1 == 0) {
                      zt_unit_test_add_assertion(test);
                      if (flag == 1) {
                        zt_unit_test_add_assertion(test);
                        if (flag2 == 3) {
                          zt_unit_test_add_assertion(test);
                          if (local_1ec == 8) {
                            local_1ec = 0xd - local_1ec;
                            zt_unit_test_add_assertion(test);
                            iVar1 = zt_opt_process_args(&local_1ec,s_argv + 8,local_1e8,
                                                        (zt_opt_validate)0x0,(zt_opt_error)0x0);
                            if (iVar1 == 0) {
                              zt_unit_test_add_assertion(test);
                              if (local_1ec == 5) {
                                zt_unit_test_add_assertion(test);
                                if (long_integer == 2) {
                                  zt_unit_test_add_assertion(test);
                                  if (long_integer2 == 4) {
                                    zt_unit_test_add_assertion(test);
                                    if (bool_type == 0) {
                                      zt_unit_test_add_assertion(test);
                                      if (str != (char *)0x0) {
                                        iVar1 = strcmp(str,"hello");
                                        if (iVar1 == 0) {
                                          zt_unit_test_add_assertion(test);
                                          if (flag == 1) {
                                            zt_unit_test_add_assertion(test);
                                            if (str != (char *)0x0) {
                                              free(str);
                                              str = (char *)0x0;
                                            }
                                            return;
                                          }
                                          pcVar2 = "flag == 1";
                                          uVar3 = 0x81;
                                          goto LAB_00111762;
                                        }
                                      }
                                      pcVar2 = "str != 0 && strcmp(str, \"hello\") == 0";
                                      uVar3 = 0x80;
                                    }
                                    else {
                                      pcVar2 = "bool_type == 0";
                                      uVar3 = 0x7f;
                                    }
                                  }
                                  else {
                                    pcVar2 = "long_integer2 == 4";
                                    uVar3 = 0x7e;
                                  }
                                }
                                else {
                                  pcVar2 = "long_integer == 2";
                                  uVar3 = 0x7d;
                                }
                              }
                              else {
                                pcVar2 = "nargc == 5";
                                uVar3 = 0x7c;
                              }
                            }
                            else {
                              pcVar2 = "ret == 0";
                              uVar3 = 0x7b;
                            }
                          }
                          else {
                            pcVar2 = "nargc == 5";
                            uVar3 = 0x78;
                            local_1ec = 0xd - local_1ec;
                          }
                        }
                        else {
                          pcVar2 = "flag2 == 3";
                          uVar3 = 0x72;
                        }
                      }
                      else {
                        pcVar2 = "flag == 1";
                        uVar3 = 0x70;
                      }
                      goto LAB_00111762;
                    }
                  }
                  pcVar2 = "str != 0 && strcmp(str, \"hello\") == 0";
                  uVar3 = 0x6f;
                }
                else {
                  pcVar2 = "bool_type == 1";
                  uVar3 = 0x6e;
                }
              }
              else {
                pcVar2 = "long_integer == 1";
                uVar3 = 0x6d;
              }
            }
            else {
              pcVar2 = "strcmp(pargv[nargc], \"test_command\") == 0";
              uVar3 = 0x6b;
            }
          }
        }
        else {
          pcVar2 = "nargc == 8";
          uVar3 = 0x69;
        }
      }
      else {
        pcVar2 = "nargc < argc";
        uVar3 = 0x67;
      }
    }
    else {
      pcVar2 = "ret == 0";
      uVar3 = 0x66;
    }
  }
  else {
    pcVar2 = "strcmp(\"error: { code: 22, string: \\\"Invalid argument: test\\\" }\", err) == 0";
    uVar3 = 0x62;
  }
LAB_00111762:
  iVar1 = zt_unit_printf(&test->error,"%s : %s:%d",pcVar2,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/opts_test.c"
                         ,uVar3);
  if (iVar1 == 0) {
    test->error = (char *)0x0;
  }
  longjmp((__jmp_buf_tag *)test->env,1);
}

Assistant:

static void
basic_opts_tests(struct zt_unit_test * test, void * data UNUSED) {
    int               argc = sizeof_array(s_argv) - 1;  /* -1 for NULL */
    int               nargc = argc;
    char           ** pargv;
    int               ret;
    char            * err;

    struct zt_opt_def options[] = {
        { 'h',        "help",     NULL, zt_opt_help_stdout, "[options]",    "This help text"     },
        { 'b',        "bool",     NULL, zt_opt_bool_int,    &bool_type,     "boolean_test"       },
        { ZT_OPT_NSO, "string",   NULL, zt_opt_string,      &str,           TEST_LONG_STRING     },
        { 'f',        "func",     NULL, local_func,         &local_data,    "generic func test"  },
        { 'l',        "long",     NULL, zt_opt_long,        &long_integer,  "long integer test"  },
        { 'L',        "long2",    NULL, zt_opt_long,        &long_integer2, "long integer2 test" },
        { ZT_OPT_NSO, "flag",     NULL, zt_opt_flag_int,    &flag,          "flag test"          },
        { 'q',        ZT_OPT_NLO, NULL, zt_opt_flag_int,    &flag2,         "flag2 test"         },
        { ZT_OPT_END() }
    };

    pargv = s_argv;


    err = zt_opt_error_str(22, "test");

    /* printf("%s\n", err); */
    ZT_UNIT_ASSERT(test, strcmp("error: { code: 22, string: \"Invalid argument: test\" }", err) == 0);

    ret = zt_opt_process_args(&nargc, pargv, options, NULL, local_error);

    ZT_UNIT_ASSERT(test, ret == 0);
    ZT_UNIT_ASSERT(test, nargc < argc); /* stopped on "test_command" */

    ZT_UNIT_ASSERT(test, nargc == 8);
    ZT_UNIT_ASSERT(test, pargv[nargc] != NULL);
    ZT_UNIT_ASSERT(test, strcmp(pargv[nargc], "test_command") == 0);

    ZT_UNIT_ASSERT(test, long_integer == 1);
    ZT_UNIT_ASSERT(test, bool_type == 1);
    ZT_UNIT_ASSERT(test, str != 0 && strcmp(str, "hello") == 0);
    ZT_UNIT_ASSERT(test, flag == 1);

    ZT_UNIT_ASSERT(test, flag2 == 3);

    /* reset for next argv */
    pargv = &pargv[nargc];
    nargc = argc - nargc;

    ZT_UNIT_ASSERT(test, nargc == 5);

    ret = zt_opt_process_args(&nargc, pargv, options, NULL, NULL);
    ZT_UNIT_ASSERT(test, ret == 0);
    ZT_UNIT_ASSERT(test, nargc == 5);
    ZT_UNIT_ASSERT(test, long_integer == 2);
    ZT_UNIT_ASSERT(test, long_integer2 == 4);
    ZT_UNIT_ASSERT(test, bool_type == 0);
    ZT_UNIT_ASSERT(test, str != 0 && strcmp(str, "hello") == 0);
    ZT_UNIT_ASSERT(test, flag == 1);

    if (str) {
        zt_free(str);
    }
}